

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChValueSpecific<chrono::ChCoordsys<double>_>::CallOut
          (ChValueSpecific<chrono::ChCoordsys<double>_> *this,ChArchiveOut *marchive)

{
  ChCoordsys<double> *auto_name;
  ChCoordsys<double> *t;
  char in_R9B;
  ChNameValue<chrono::ChCoordsys<double>_> local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  ChValueSpecific<chrono::ChCoordsys<double>_> *this_local;
  
  auto_name = this->_ptr_to_val;
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  t = (ChCoordsys<double> *)std::__cxx11::string::c_str();
  make_ChNameValue<chrono::ChCoordsys<double>>
            (&local_30,(chrono *)"*this->_ptr_to_val",(char *)auto_name,t,(char *)0x0,in_R9B);
  ChArchiveOut::out<chrono::ChCoordsys<double>>(marchive,&local_30);
  ChNameValue<chrono::ChCoordsys<double>_>::~ChNameValue(&local_30);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}